

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.cpp
# Opt level: O2

void CaDiCaL::Signal::reset(void)

{
  signal_handler = 0;
  signal(6,SIGABRT_handler);
  SIGABRT_handler = (__sighandler_t)0x0;
  signal(2,SIGINT_handler);
  SIGINT_handler = (__sighandler_t)0x0;
  signal(0xb,SIGSEGV_handler);
  SIGSEGV_handler = (__sighandler_t)0x0;
  signal(0xf,SIGTERM_handler);
  SIGTERM_handler = (__sighandler_t)0x0;
  reset_alarm();
  caught_signal = 0;
  return;
}

Assistant:

void Signal::reset () {
  signal_handler = 0;
#define SIGNAL(SIG) \
  (void) signal (SIG, SIG##_handler); \
  SIG##_handler = 0;
  SIGNALS
#undef SIGNAL
#ifndef __WIN32
  reset_alarm ();
#endif
  caught_signal = false;
}